

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

string * phosg::parse_data_string
                   (string *__return_storage_ptr__,string *s,string *mask,uint64_t flags)

{
  size_type sVar1;
  float fVar2;
  bool bVar3;
  byte bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool bVar5;
  char cVar6;
  byte __c;
  bool bVar7;
  ushort uVar8;
  uint uVar9;
  pointer pcVar10;
  ulong uVar11;
  ulonglong uVar12;
  uint uVar13;
  char *pcVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  char *local_a0;
  byte local_95;
  uint local_94;
  string *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined4 local_7c;
  int16_t value;
  undefined6 uStack_76;
  ulong local_58;
  string filename;
  
  pcVar14 = (s->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (mask != (string *)0x0) {
    mask->_M_string_length = 0;
    *(mask->_M_dataplus)._M_p = '\0';
  }
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  bVar3 = true;
  local_7c = 0;
  bVar5 = false;
  bVar15 = false;
  bVar16 = false;
  bVar17 = false;
  bVar7 = false;
  local_94 = 0;
  local_95 = 1;
  local_90 = mask;
  local_88 = __return_storage_ptr__;
  local_58 = flags;
LAB_001108ab:
  do {
    this = local_88;
    bVar4 = local_95;
    cVar6 = *pcVar14;
    uVar13 = (uint)cVar6;
    if (cVar6 == '\0') {
LAB_00110ec5:
      ::std::__cxx11::string::~string((string *)&filename);
      return __return_storage_ptr__;
    }
    if (bVar16) {
      bVar16 = cVar6 != '\n';
LAB_001108c7:
      local_a0 = pcVar14 + 1;
      pcVar14 = local_a0;
      goto LAB_001108ab;
    }
    if (bVar17) {
      if ((cVar6 == '*') && (pcVar14[1] == '/')) {
        local_a0 = pcVar14 + 2;
LAB_00110cbd:
        bVar16 = false;
        bVar17 = false;
        pcVar14 = local_a0;
      }
      else {
        local_a0 = pcVar14 + 1;
        bVar17 = true;
        bVar16 = false;
        pcVar14 = local_a0;
      }
    }
    else {
      if (bVar5) {
        if (cVar6 == '\\') {
          cVar6 = pcVar14[1];
          if ((cVar6 != '\"') && (cVar6 != '\'')) {
            if (cVar6 == 'n') {
              cVar6 = '\n';
            }
            else if (cVar6 == 'r') {
              cVar6 = '\r';
            }
            else if (cVar6 == 't') {
              cVar6 = '\t';
            }
            else if (cVar6 == '\0') goto LAB_00110ec5;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,cVar6);
          add_mask_bits(local_90,(bool)(bVar4 & 1),1);
          local_a0 = pcVar14 + 2;
        }
        else {
          if (cVar6 == '\"') {
            local_a0 = pcVar14 + 1;
            goto LAB_00110cbb;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,cVar6);
          add_mask_bits(local_90,(bool)(bVar4 & 1),1);
          local_a0 = pcVar14 + 1;
        }
        bVar5 = true;
        goto LAB_00110b17;
      }
      if (bVar15) {
        if (cVar6 == '\\') {
          cVar6 = pcVar14[1];
          if (cVar6 == 'n') {
            value = 10;
            uVar8 = 10;
          }
          else if (cVar6 == 'r') {
            value = 0xd;
            uVar8 = 0xd;
          }
          else if (cVar6 == 't') {
            value = 9;
            uVar8 = 9;
          }
          else {
            if (cVar6 == '\0') goto LAB_00110ec5;
            uVar8 = (ushort)cVar6;
            value = (short)cVar6;
          }
          if ((local_94 & 1) != 0) {
            value = uVar8 << 8 | uVar8 >> 8;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&value,2);
          add_mask_bits(local_90,(bool)(bVar4 & 1),2);
          local_a0 = pcVar14 + 2;
        }
        else {
          if (cVar6 == '\'') {
            local_a0 = pcVar14 + 1;
            bVar5 = false;
            bVar15 = false;
            goto LAB_00110cbd;
          }
          uVar9 = (uint)(ushort)((short)cVar6 << 8 | (ushort)(short)cVar6 >> 8);
          if ((local_94 & 1) == 0) {
            uVar9 = uVar13;
          }
          value = (short)uVar9;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&value,2);
          add_mask_bits(local_90,(bool)(bVar4 & 1),2);
          local_a0 = pcVar14 + 1;
        }
        bVar15 = true;
LAB_00110cbb:
        bVar5 = false;
        goto LAB_00110cbd;
      }
      if (bVar7) {
        bVar7 = cVar6 != '>';
        if (cVar6 == '>') {
          sVar1 = local_88->_M_string_length;
          load_file((string *)&value,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filename);
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &value);
          ::std::__cxx11::string::~string((string *)&value);
          add_mask_bits(local_90,(bool)(bVar4 & 1),this->_M_string_length - sVar1);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filename,
                     1,cVar6);
        }
        local_a0 = pcVar14 + 1;
        bVar5 = false;
        bVar15 = false;
LAB_00110b17:
        bVar17 = false;
        bVar16 = false;
        __return_storage_ptr__ = local_88;
        pcVar14 = local_a0;
      }
      else {
        if (cVar6 == '#') {
          local_a0 = pcVar14 + 1;
          if (pcVar14[1] == '#') {
            local_a0 = pcVar14 + 2;
            if (pcVar14[2] == '#') {
              local_a0 = pcVar14 + 3;
              if (pcVar14[3] == '#') {
                local_a0 = pcVar14 + 4;
                pcVar10 = (pointer)strtoull(local_a0,&local_a0,0);
                _value = (pointer)((ulong)pcVar10 >> 0x38 |
                                   ((ulong)pcVar10 & 0xff000000000000) >> 0x28 |
                                   ((ulong)pcVar10 & 0xff0000000000) >> 0x18 |
                                   ((ulong)pcVar10 & 0xff00000000) >> 8 |
                                   ((ulong)pcVar10 & 0xff000000) << 8 |
                                   ((ulong)pcVar10 & 0xff0000) << 0x18 |
                                   ((ulong)pcVar10 & 0xff00) << 0x28 | (long)pcVar10 << 0x38);
                if ((local_94 & 1) == 0) {
                  _value = pcVar10;
                }
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,(char *)&value,8);
                add_mask_bits(local_90,(bool)(bVar4 & 1),8);
              }
              else {
                uVar12 = strtoull(local_a0,&local_a0,0);
                uVar9 = (uint)uVar12;
                uVar13 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                         uVar9 << 0x18;
                if ((local_94 & 1) == 0) {
                  uVar13 = uVar9;
                }
                _value = (float)uVar13;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __return_storage_ptr__,(char *)&value,4);
                add_mask_bits(local_90,(bool)(bVar4 & 1),4);
              }
            }
            else {
              uVar12 = strtoull(local_a0,&local_a0,0);
              uVar8 = (ushort)uVar12;
              if ((local_94 & 1) != 0) {
                uVar8 = uVar8 << 8 | uVar8 >> 8;
              }
              value = uVar8;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&value,2);
              add_mask_bits(local_90,(bool)(bVar4 & 1),2);
            }
            goto LAB_00110df8;
          }
          uVar12 = strtoull(local_a0,&local_a0,0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,1,(char)uVar12);
          add_mask_bits(local_90,(bool)(bVar4 & 1),1);
          bVar5 = false;
          bVar15 = false;
          bVar7 = false;
          goto LAB_00110b17;
        }
        if (cVar6 == '$') {
          local_94 = local_94 ^ 1;
LAB_00110b2b:
          local_a0 = pcVar14 + 1;
        }
        else {
          if (cVar6 == '%') {
            local_a0 = pcVar14 + 1;
            if (pcVar14[1] == '%') {
              local_a0 = pcVar14 + 2;
              pcVar10 = (pointer)strtod(local_a0,&local_a0);
              _value = (pointer)((ulong)pcVar10 >> 0x38 |
                                 ((ulong)pcVar10 & 0xff000000000000) >> 0x28 |
                                 ((ulong)pcVar10 & 0xff0000000000) >> 0x18 |
                                 ((ulong)pcVar10 & 0xff00000000) >> 8 |
                                 ((ulong)pcVar10 & 0xff000000) << 8 |
                                 ((ulong)pcVar10 & 0xff0000) << 0x18 |
                                 ((ulong)pcVar10 & 0xff00) << 0x28 | (long)pcVar10 << 0x38);
              if ((local_94 & 1) == 0) {
                _value = pcVar10;
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&value,8);
              add_mask_bits(local_90,(bool)(bVar4 & 1),8);
            }
            else {
              fVar18 = strtof(local_a0,&local_a0);
              fVar2 = (float)((uint)fVar18 >> 0x18 | ((uint)fVar18 & 0xff0000) >> 8 |
                              ((uint)fVar18 & 0xff00) << 8 | (int)fVar18 << 0x18);
              if ((local_94 & 1) == 0) {
                fVar2 = fVar18;
              }
              _value = fVar2;
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,(char *)&value,4);
              add_mask_bits(local_90,(bool)(bVar4 & 1),4);
            }
            goto LAB_00110df8;
          }
          if (cVar6 == '?') {
            local_95 = local_95 ^ 1;
            goto LAB_00110b2b;
          }
          uVar11 = (ulong)(uVar13 - 0x30);
          if (9 < (byte)(uVar13 - 0x30)) {
            if ((byte)(cVar6 + 0xbfU) < 6) {
              uVar11 = (ulong)(uVar13 - 0x37);
            }
            else {
              if (5 < (byte)(cVar6 + 0x9fU)) {
                if (cVar6 == '\"') {
                  bVar5 = true;
LAB_00110e91:
                  bVar15 = false;
LAB_00110e94:
                  bVar16 = false;
                  bVar17 = false;
                }
                else {
                  if (cVar6 == '<') {
                    if ((local_58 & 1) != 0) {
                      filename._M_string_length = 0;
                      *filename._M_dataplus._M_p = '\0';
                      bVar7 = true;
                      bVar5 = false;
                      bVar15 = false;
                      bVar16 = false;
                      bVar17 = false;
                      goto LAB_001108c7;
                    }
LAB_00110e76:
                    bVar5 = false;
                    goto LAB_00110e91;
                  }
                  if (cVar6 != '/') {
                    if (cVar6 != '\'') goto LAB_00110e76;
                    bVar15 = true;
                    bVar5 = false;
                    goto LAB_00110e94;
                  }
                  bVar16 = pcVar14[1] == '/';
                  bVar17 = pcVar14[1] == '*';
                  bVar5 = false;
                  bVar15 = false;
                }
                bVar7 = false;
                goto LAB_001108c7;
              }
              uVar11 = (ulong)CONCAT31(cVar6 >> 7,cVar6 + -0x57);
            }
          }
          __c = (byte)uVar11 | (byte)local_7c;
          local_a0 = pcVar14 + 1;
          if (bVar3) {
            local_7c = (undefined4)CONCAT71((int7)(uVar11 >> 8),__c << 4);
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __return_storage_ptr__,__c);
            add_mask_bits(local_90,(bool)(bVar4 & 1),1);
            local_7c = 0;
            __return_storage_ptr__ = local_88;
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
LAB_00110df8:
        bVar5 = false;
        bVar15 = false;
        bVar16 = false;
        bVar17 = false;
        bVar7 = false;
        pcVar14 = local_a0;
      }
    }
  } while( true );
}

Assistant:

string parse_data_string(const string& s, string* mask, uint64_t flags) {
  bool allow_files = flags & ParseDataFlags::ALLOW_FILES;

  const char* in = s.c_str();

  string data;
  if (mask) {
    mask->clear();
  }

#ifdef PHOSG_BIG_ENDIAN
  constexpr bool host_big_endian = true;
#else
  constexpr bool host_big_endian = false;
#endif

  uint8_t chr = 0;
  bool reading_string = false;
  bool reading_unicode_string = false;
  bool reading_comment = false;
  bool reading_multiline_comment = false;
  bool reading_high_nybble = true;
  bool reading_filename = false;
  bool big_endian = false;
  bool mask_enabled = true;
  string filename;
  while (in[0]) {
    bool read_nybble = 0;

    // if between // and a newline, don't write to output buffer
    if (reading_comment) {
      if (in[0] == '\n') {
        reading_comment = false;
      }
      in++;

      // if between /* and */, don't write to output buffer
    } else if (reading_multiline_comment) {
      if ((in[0] == '*') && (in[1] == '/')) {
        reading_multiline_comment = 0;
        in += 2;
      } else {
        in++;
      }

      // if between quotes, read bytes to output buffer, unescaping where needed
    } else if (reading_string) {
      if (in[0] == '\"') {
        reading_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          data += '\n';
        } else if (in[1] == 'r') {
          data += '\r';
        } else if (in[1] == 't') {
          data += '\t';
        } else if (in[1] == '\"') {
          data += '\"';
        } else if (in[1] == '\'') {
          data += '\'';
        } else {
          data += in[1];
        }
        add_mask_bits(mask, mask_enabled, 1);
        in += 2;

      } else {
        data += in[0];
        add_mask_bits(mask, mask_enabled, 1);
        in++;
      }

      // if between single quotes, word-expand bytes to output buffer, unescaping
    } else if (reading_unicode_string) {
      if (in[0] == '\'') {
        reading_unicode_string = 0;
        in++;

      } else if (in[0] == '\\') { // unescape char after a backslash
        int16_t value;
        if (!in[1]) {
          return data;
        } else if (in[1] == 'n') {
          value = '\n';
        } else if (in[1] == 'r') {
          value = '\r';
        } else if (in[1] == 't') {
          value = '\t';
        } else {
          value = in[1];
        }
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in += 2;

      } else {
        int16_t value = in[0];
        if (big_endian != host_big_endian) {
          value = bswap16(value);
        }
        data.append((const char*)&value, 2);
        add_mask_bits(mask, mask_enabled, 2);
        in++;
      }

      // if between <>, read a file name, then stick that file into the buffer
    } else if (reading_filename) {
      if (in[0] == '>') {
        // TODO: support <filename@offset:size> syntax
        reading_filename = 0;
        size_t pre_size = data.size();
        data += load_file(filename);
        add_mask_bits(mask, mask_enabled, data.size() - pre_size);

      } else {
        filename.append(1, in[0]);
      }
      in++;

      // ? inverts mask_enabled
    } else if (in[0] == '?') {
      mask_enabled = !mask_enabled;
      in++;

      // $ changes the endianness
    } else if (in[0] == '$') {
      big_endian = !big_endian;
      in++;

      // # signifies a decimal number
    } else if (in[0] == '#') { // 8-bit
      in++;
      if (in[0] == '#') { // 16-bit
        in++;
        if (in[0] == '#') { // 32-bit
          in++;
          if (in[0] == '#') { // 64-bit
            in++;
            uint64_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap64(value);
            }
            data.append((const char*)&value, 8);
            add_mask_bits(mask, mask_enabled, 8);

          } else {
            uint32_t value = strtoull(in, const_cast<char**>(&in), 0);
            if (big_endian != host_big_endian) {
              value = bswap32(value);
            }
            data.append((const char*)&value, 4);
            add_mask_bits(mask, mask_enabled, 4);
          }

        } else {
          uint16_t value = strtoull(in, const_cast<char**>(&in), 0);
          if (big_endian != host_big_endian) {
            value = bswap16(value);
          }
          data.append((const char*)&value, 2);
          add_mask_bits(mask, mask_enabled, 2);
        }

      } else {
        data.append(1, (char)strtoull(in, const_cast<char**>(&in), 0));
        add_mask_bits(mask, mask_enabled, 1);
      }

      // % is a float, %% is a double
    } else if (in[0] == '%') {
      in++;
      if (in[0] == '%') {
        in++;

        uint64_t value;
        *(double*)&value = strtod(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap64(value);
        }
        data.append((const char*)&value, 8);
        add_mask_bits(mask, mask_enabled, 8);

      } else {
        uint32_t value;
        *(float*)&value = strtof(in, const_cast<char**>(&in));
        if (big_endian != host_big_endian) {
          value = bswap32(value);
        }
        data.append((const char*)&value, 4);
        add_mask_bits(mask, mask_enabled, 4);
      }

      // anything else is a hex digit
    } else {
      if ((in[0] >= '0') && (in[0] <= '9')) {
        read_nybble = true;
        chr |= (in[0] - '0');

      } else if ((in[0] >= 'A') && (in[0] <= 'F')) {
        read_nybble = true;
        chr |= (in[0] - 'A' + 0x0A);

      } else if ((in[0] >= 'a') && (in[0] <= 'f')) {
        read_nybble = true;
        chr |= (in[0] - 'a' + 0x0A);

      } else if (in[0] == '\"') {
        reading_string = true;

      } else if (in[0] == '\'') {
        reading_unicode_string = 1;

      } else if ((in[0] == '/') && (in[1] == '/')) {
        reading_comment = 1;

      } else if ((in[0] == '/') && (in[1] == '*')) {
        reading_multiline_comment = 1;

      } else if (in[0] == '<' && allow_files) {
        reading_filename = 1;
        filename.clear();
      }
      in++;
    }

    if (read_nybble) {
      if (reading_high_nybble) {
        chr = chr << 4;
      } else {
        data += (char)chr;
        add_mask_bits(mask, mask_enabled, 1);
        chr = 0;
      }
      reading_high_nybble = !reading_high_nybble;
    }
  }
  return data;
}